

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  CppType CVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  Arena *pAVar6;
  Arena *pAVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogMessage local_78;
  ExtensionSet *local_40;
  LogFinisher local_31;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  pAVar7 = (Arena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  local_40 = this;
  pVar8 = Insert(this,number);
  pEVar3 = pVar8.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    CVar1 = anon_unknown_22::cpp_type(pEVar3->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x285);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    if ((pEVar3->field_0xa & 0x10) != 0) {
      (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).options_.start_block_size)((pEVar3->field_0).repeated_string_value,message);
      goto LAB_00267dc9;
    }
    pAVar6 = local_40->arena_;
    if (pAVar6 == (Arena *)0x0) {
      if ((pEVar3->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
        goto LAB_00267cbe;
      }
      pAVar6 = (Arena *)0x0;
    }
  }
  else {
    pEVar3->type = type;
    CVar1 = anon_unknown_22::cpp_type(type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x278);
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_78);
    }
    pEVar3->is_repeated = false;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf;
LAB_00267cbe:
    pAVar6 = local_40->arena_;
  }
  if (pAVar7 == pAVar6) {
    (pEVar3->field_0).message_value = message;
  }
  else if (pAVar7 == (Arena *)0x0) {
    (pEVar3->field_0).message_value = message;
    Arena::Own<google::protobuf::MessageLite>(local_40->arena_,message);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[4])(message);
    pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var,iVar2);
    (pEVar3->field_0).repeated_string_value = pRVar5;
    (*(code *)(((pRVar5->super_RepeatedPtrFieldBase).arena_)->impl_).options_.initial_block_size)
              (pRVar5,message);
  }
LAB_00267dc9:
  pEVar3->field_0xa = pEVar3->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}